

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_sequential_encoder.cc
# Opt level: O1

Status * __thiscall
draco::PointCloudSequentialEncoder::EncodeGeometryData
          (Status *__return_storage_ptr__,PointCloudSequentialEncoder *this)

{
  EncoderBuffer *pEVar1;
  int32_t num_points;
  ValueType local_c;
  
  local_c = ((this->super_PointCloudEncoder).point_cloud_)->num_points_;
  pEVar1 = (this->super_PointCloudEncoder).buffer_;
  if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar1,
               (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_c,&stack0xfffffffffffffff8);
  }
  __return_storage_ptr__->code_ = OK;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_string_length = 0;
  (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudSequentialEncoder::EncodeGeometryData() {
  const int32_t num_points = point_cloud()->num_points();
  buffer()->Encode(num_points);
  return OkStatus();
}